

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,string *value)

{
  uint length;
  char *pcVar1;
  string *value_local;
  Value *this_local;
  
  initBasic(this,stringValue,true);
  pcVar1 = (char *)std::__cxx11::string::data();
  length = std::__cxx11::string::length();
  pcVar1 = duplicateAndPrefixStringValue(pcVar1,length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const JSONCPP_STRING& value) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateAndPrefixStringValue(value.data(), static_cast<unsigned>(value.length()));
}